

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O2

void __thiscall
TPZTransfer<std::complex<double>_>::TransferSolution
          (TPZTransfer<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *coarsesol,
          TPZFMatrix<std::complex<double>_> *finesol)

{
  int64_t iVar1;
  undefined8 uVar2;
  ulong uVar3;
  complex<double> *pcVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int c;
  int iVar10;
  int i_1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  undefined8 uVar11;
  TPZFMatrix<std::complex<double>_> tempfine;
  TPZFMatrix<std::complex<double>_> tempcoarse;
  TPZFMatrix<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  uVar5 = (coarsesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  uVar8 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  iVar9 = *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.field_0x1c;
  uVar3 = (ulong)iVar9;
  iVar7 = (int)uVar5;
  iVar10 = (int)uVar8;
  if (((int)(finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol != iVar7) ||
     ((long)(int)(finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow !=
      uVar3 * uVar8)) {
    (*(finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xe])(finesol,(long)(iVar9 * iVar10),(long)iVar7);
    uVar3 = (ulong)*(uint *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                             field_0x1c;
  }
  if ((int)uVar3 != 1) {
    iVar9 = 0;
    uVar6 = 0;
    if (0 < iVar7) {
      uVar6 = uVar5 & 0xffffffff;
    }
    uVar5 = 0;
    if (0 < iVar10) {
      uVar5 = uVar8 & 0xffffffff;
    }
    for (; iVar9 < (int)uVar3; iVar9 = iVar9 + 1) {
      TPZFMatrix<std::complex<double>_>::TPZFMatrix(&local_c0,(long)(int)iVar1,(long)iVar7);
      TPZFMatrix<std::complex<double>_>::TPZFMatrix(&local_150,(long)iVar10,(long)iVar7);
      for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          (*(coarsesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable
            ._vptr_TPZSavable[0x24])
                    (coarsesol,
                     (long)(*(int *)&(this->super_TPZMatrix<std::complex<double>_>).
                                     super_TPZBaseMatrix.field_0x1c * (int)uVar8 + iVar9),uVar3);
          uVar11 = in_XMM1_Qa;
          pcVar4 = TPZFMatrix<std::complex<double>_>::operator()(&local_c0,uVar8,uVar3);
          *(ulong *)pcVar4->_M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          *(undefined8 *)(pcVar4->_M_value + 8) = in_XMM1_Qa;
          in_XMM1_Qa = uVar11;
        }
      }
      MultiplyScalar(this,&local_c0,&local_150,0);
      for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          uVar11 = *(undefined8 *)
                    local_150.fElem
                    [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                     uVar3 + uVar8]._M_value;
          uVar2 = *(undefined8 *)
                   (local_150.fElem
                    [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                     uVar3 + uVar8]._M_value + 8);
          pcVar4 = TPZFMatrix<std::complex<double>_>::operator()
                             (finesol,(long)(*(int *)&(this->super_TPZMatrix<std::complex<double>_>)
                                                      .super_TPZBaseMatrix.field_0x1c * (int)uVar8 +
                                            iVar9),uVar3);
          *(undefined8 *)pcVar4->_M_value = uVar11;
          *(undefined8 *)(pcVar4->_M_value + 8) = uVar2;
        }
      }
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_150);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
      uVar3 = (ulong)*(uint *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               field_0x1c;
    }
    return;
  }
  MultiplyScalar(this,coarsesol,finesol,0);
  return;
}

Assistant:

void TPZTransfer<TVar>::TransferSolution(const TPZFMatrix<TVar> &coarsesol, TPZFMatrix<TVar> &finesol){
	int iv;
	int nrf = finesol.Rows();
	int ncf = finesol.Cols();
	int nrc = coarsesol.Rows();
	int ncc = coarsesol.Cols();
    int thisr = this->Rows();
    int thisc = this->Cols();
	if(nrf != this->Rows()*fNTVarVar || ncf != ncc) {
		nrf = this->Rows()*fNTVarVar;
		ncf = ncc;
		finesol.Redim(nrf,ncf);
	}
    if (fNTVarVar == 1) {
        MultiplyScalar(coarsesol,finesol,0);
    }
    else
    {
        for(iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisc,ncc), tempfine(thisr,ncf);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    tempcoarse(i,c) = coarsesol.GetVal(iv+i*fNTVarVar,c);

                }
            }
            MultiplyScalar(tempcoarse, tempfine, 0);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    finesol(iv+i*fNTVarVar,c) = tempfine.GetVal(i,c);
                    
                }
            }
        }
    }
}